

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  cmLocalGenerator *this_00;
  cmMakefile *makefile;
  cmGeneratorTarget *this_01;
  __type _Var1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  string *psVar5;
  string *__rhs;
  long lVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  string targetName;
  string compiler;
  string fastTarget;
  char *in_stack_ffffffffffffff20;
  pointer local_a8;
  string local_a0;
  pointer local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&local_a0);
  psVar4 = cmMakefile::GetRequiredDefinition(mf,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  ppcVar7 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_a8 = ppcVar7;
  if (ppcVar7 !=
      (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"all",(allocator<char> *)&local_50);
    AppendTarget(this,fout,&local_a0,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,
                 (psVar4->_M_dataplus)._M_p,mf,in_stack_ffffffffffffff20,sourceFileFlags,true);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"clean",(allocator<char> *)&local_50);
    AppendTarget(this,fout,&local_a0,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,
                 (psVar4->_M_dataplus)._M_p,mf,in_stack_ffffffffffffff20,sourceFileFlags,false);
    std::__cxx11::string::~string((string *)&local_a0);
    ppcVar7 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_a8 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
  }
  do {
    if (ppcVar7 == local_a8) {
      std::__cxx11::string::~string((string *)&local_70);
      return;
    }
    this_00 = *ppcVar7;
    makefile = this_00->Makefile;
    local_78 = (this_00->GeneratorTargets).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    local_80 = ppcVar7;
    for (ppcVar8 = (this_00->GeneratorTargets).
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar8 != local_78;
        ppcVar8 = ppcVar8 + 1) {
      this_01 = *ppcVar8;
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
      std::__cxx11::string::string((string *)&local_a0,(string *)psVar5);
      TVar3 = cmGeneratorTarget::GetType(this_01);
      if (TVar3 < UTILITY) {
        AppendTarget(this,fout,&local_a0,this_00,this_01,(psVar4->_M_dataplus)._M_p,makefile,
                     in_stack_ffffffffffffff20,sourceFileFlags,false);
        std::__cxx11::string::string((string *)&local_50,(string *)&local_a0);
        std::__cxx11::string::append((char *)&local_50);
        AppendTarget(this,fout,&local_50,this_00,this_01,(psVar4->_M_dataplus)._M_p,makefile,
                     in_stack_ffffffffffffff20,sourceFileFlags,false);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else if (TVar3 == UTILITY) {
        lVar6 = std::__cxx11::string::find((char *)&local_a0,0x430256);
        if ((((lVar6 != 0) || (bVar2 = std::operator!=(&local_a0,"Nightly"), !bVar2)) &&
            ((lVar6 = std::__cxx11::string::find((char *)&local_a0,0x43025e), lVar6 != 0 ||
             (bVar2 = std::operator!=(&local_a0,"Continuous"), !bVar2)))) &&
           ((lVar6 = std::__cxx11::string::find((char *)&local_a0,0x430269), lVar6 != 0 ||
            (bVar2 = std::operator!=(&local_a0,"Experimental"), !bVar2)))) {
LAB_00283596:
          AppendTarget(this,fout,&local_a0,this_00,(cmGeneratorTarget *)0x0,
                       (psVar4->_M_dataplus)._M_p,makefile,in_stack_ffffffffffffff20,sourceFileFlags
                       ,false);
        }
      }
      else if (TVar3 == GLOBAL_TARGET) {
        psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
        __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
        _Var1 = std::operator==(psVar5,__rhs);
        if (_Var1) goto LAB_00283596;
      }
      std::__cxx11::string::~string((string *)&local_a0);
    }
    ppcVar7 = local_80 + 1;
  } while( true );
}

Assistant:

void cmExtraSublimeTextGenerator::AppendAllTargets(
  const std::vector<cmLocalGenerator*>& lgs, const cmMakefile* mf,
  cmGeneratedFileStream& fout, MapSourceFileFlags& sourceFileFlags)
{
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler;
  if (!lgs.empty()) {
    this->AppendTarget(fout, "all", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, true);
    this->AppendTarget(fout, "clean", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, false);
  }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                               makefile, compiler.c_str(), sourceFileFlags,
                               false);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, lg, target, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, lg, target, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
        } break;
        default:
          break;
      }
    }
  }
}